

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall
embree::SceneGraphFlattener::convertMultiLevelInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node)

{
  _Rb_tree_header *p_Var1;
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *pmVar2;
  Ref<embree::SceneGraph::Node> *pRVar3;
  undefined8 uVar4;
  long *plVar5;
  long *plVar6;
  TransformNode *pTVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  Ref<embree::SceneGraph::Node> *child;
  Ref<embree::SceneGraph::Node> *node_00;
  bool bVar11;
  undefined1 local_48 [16];
  map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::GroupNode::typeinfo,0);
  }
  if (plVar5 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar6 = (long *)0x0;
    }
    else {
      plVar6 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                      &SceneGraph::TriangleMeshNode::typeinfo,0);
    }
    if (plVar6 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar6 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                        &SceneGraph::QuadMeshNode::typeinfo,0);
      }
      if (plVar6 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          plVar6 = (long *)0x0;
        }
        else {
          plVar6 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                          &SceneGraph::GridMeshNode::typeinfo,0);
        }
        if (plVar6 == (long *)0x0) {
          if (node->ptr == (Node *)0x0) {
            plVar6 = (long *)0x0;
          }
          else {
            plVar6 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                            &SceneGraph::SubdivMeshNode::typeinfo,0);
          }
          if (plVar6 == (long *)0x0) {
            if (node->ptr == (Node *)0x0) {
              plVar6 = (long *)0x0;
            }
            else {
              plVar6 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                              &SceneGraph::HairSetNode::typeinfo,0);
            }
            if (plVar6 == (long *)0x0) {
              if (node->ptr == (Node *)0x0) {
                plVar6 = (long *)0x0;
              }
              else {
                plVar6 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                                &SceneGraph::PointSetNode::typeinfo,0);
              }
              if (plVar6 == (long *)0x0) {
                p_Var10 = (this->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent;
                p_Var1 = &(this->object_mapping)._M_t._M_impl.super__Rb_tree_header;
                p_Var9 = &p_Var1->_M_header;
                if (p_Var10 != (_Base_ptr)0x0) {
                  do {
                    bVar11 = *(Node **)(p_Var10 + 1) < node->ptr;
                    if (!bVar11) {
                      p_Var9 = p_Var10;
                    }
                    p_Var10 = (&p_Var10->_M_left)[bVar11];
                  } while (p_Var10 != (_Base_ptr)0x0);
                }
                p_Var10 = &p_Var1->_M_header;
                if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
                   (p_Var10 = p_Var9, node->ptr < *(Node **)(p_Var9 + 1))) {
                  p_Var10 = &p_Var1->_M_header;
                }
                pmVar2 = &this->object_mapping;
                if ((_Rb_tree_header *)p_Var10 == p_Var1) {
                  if (node->ptr == (Node *)0x0) {
                    local_48._8_8_ = (long *)0x0;
                  }
                  else {
                    local_48._8_8_ =
                         __dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                        &SceneGraph::TransformNode::typeinfo,0);
                  }
                  local_38 = pmVar2;
                  if ((long *)local_48._8_8_ == (long *)0x0) {
                    if (node->ptr == (Node *)0x0) {
                      plVar6 = (long *)0x0;
                    }
                    else {
                      plVar6 = (long *)__dynamic_cast(node->ptr,&SceneGraph::Node::typeinfo,
                                                      &SceneGraph::MultiTransformNode::typeinfo,0);
                    }
                    if (plVar6 != (long *)0x0) {
                      (**(code **)(*plVar6 + 0x10))(plVar6);
                      pTVar7 = (TransformNode *)alignedMalloc(0x88,0x10);
                      convertMultiLevelInstances((SceneGraphFlattener *)local_48,&this->node);
                      SceneGraph::MultiTransformNode::MultiTransformNode
                                ((MultiTransformNode *)pTVar7,
                                 (vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                  *)(plVar6 + 0xd),(Ref<embree::SceneGraph::Node> *)local_48);
                      if ((TransformNode *)local_48._0_8_ != (TransformNode *)0x0) {
                        (*(((Node *)local_48._0_8_)->super_RefCount)._vptr_RefCount[3])();
                      }
                      pmVar8 = std::
                               map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               ::operator[](local_38,node);
                      (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[2])(pTVar7);
                      if (pmVar8->ptr != (Node *)0x0) {
                        (*(pmVar8->ptr->super_RefCount)._vptr_RefCount[3])();
                      }
                      pmVar8->ptr = (Node *)pTVar7;
                      local_48._0_8_ = pTVar7;
                      (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[2])(pTVar7);
                      std::
                      vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                      ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                                ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                                  *)group,(Ref<embree::SceneGraph::Node> *)local_48);
                      if ((TransformNode *)local_48._0_8_ != (TransformNode *)0x0) {
                        (*(((Node *)local_48._0_8_)->super_RefCount)._vptr_RefCount[3])();
                      }
                    }
                    if (plVar6 != (long *)0x0) {
                      (**(code **)(*plVar6 + 0x18))(plVar6);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_48._8_8_ + 0x10))(local_48._8_8_);
                    pTVar7 = (TransformNode *)alignedMalloc(0xa0,0x10);
                    uVar4 = local_48._8_8_;
                    convertMultiLevelInstances((SceneGraphFlattener *)local_48,&this->node);
                    SceneGraph::TransformNode::TransformNode
                              (pTVar7,(Transformations *)(uVar4 + 0x68),
                               (Ref<embree::SceneGraph::Node> *)local_48);
                    pmVar2 = local_38;
                    if ((TransformNode *)local_48._0_8_ != (TransformNode *)0x0) {
                      (*(((Node *)local_48._0_8_)->super_RefCount)._vptr_RefCount[3])();
                    }
                    pmVar8 = std::
                             map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             ::operator[](pmVar2,node);
                    (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[2])(pTVar7);
                    if (pmVar8->ptr != (Node *)0x0) {
                      (*(pmVar8->ptr->super_RefCount)._vptr_RefCount[3])();
                    }
                    pmVar8->ptr = (Node *)pTVar7;
                    local_48._0_8_ = pTVar7;
                    (*(pTVar7->super_Node).super_RefCount._vptr_RefCount[2])(pTVar7);
                    std::
                    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                              ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                                *)group,(Ref<embree::SceneGraph::Node> *)local_48);
                    if ((TransformNode *)local_48._0_8_ != (TransformNode *)0x0) {
                      (*(((Node *)local_48._0_8_)->super_RefCount)._vptr_RefCount[3])();
                    }
                  }
                  if ((long *)local_48._8_8_ != (long *)0x0) {
                    (**(code **)(*(long *)local_48._8_8_ + 0x18))();
                  }
                  goto LAB_0015830c;
                }
                node = std::
                       map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                       ::operator[](pmVar2,node);
              }
              else {
                (**(code **)(*plVar6 + 0x10))(plVar6);
                (**(code **)(*plVar6 + 0x18))(plVar6);
              }
            }
            else {
              (**(code **)(*plVar6 + 0x10))(plVar6);
              (**(code **)(*plVar6 + 0x18))(plVar6);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x10))(plVar6);
            (**(code **)(*plVar6 + 0x18))(plVar6);
          }
        }
        else {
          (**(code **)(*plVar6 + 0x10))(plVar6);
          (**(code **)(*plVar6 + 0x18))(plVar6);
        }
      }
      else {
        (**(code **)(*plVar6 + 0x10))(plVar6);
        (**(code **)(*plVar6 + 0x18))(plVar6);
      }
    }
    else {
      (**(code **)(*plVar6 + 0x10))(plVar6);
      (**(code **)(*plVar6 + 0x18))(plVar6);
    }
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::push_back(group,node);
  }
  else {
    (**(code **)(*plVar5 + 0x10))(plVar5);
    pRVar3 = (Ref<embree::SceneGraph::Node> *)plVar5[0xe];
    for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar5[0xd]; node_00 != pRVar3;
        node_00 = node_00 + 1) {
      convertMultiLevelInstances(this,group,node_00);
    }
  }
LAB_0015830c:
  if (plVar5 != (long *)0x0) {
    (**(code **)(*plVar5 + 0x18))(plVar5);
  }
  return;
}

Assistant:

void convertMultiLevelInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node)
    {
      if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertMultiLevelInstances(group,child);
      }
      else if (node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::QuadMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::GridMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::HairSetNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::PointSetNode>()) {
        group.push_back(node);
      }
      else if (object_mapping.find(node) != object_mapping.end()) {
        group.push_back(object_mapping[node]);
      }
      else if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>())
      {
        auto new_node = new SceneGraph::TransformNode(xfmNode->spaces,convertMultiLevelInstances(xfmNode->child));
        object_mapping[node] = new_node;
        group.push_back(new_node);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>())
      {
        auto new_node = new SceneGraph::MultiTransformNode(xfmNode->spaces,convertMultiLevelInstances(xfmNode->child));
        object_mapping[node] = new_node;
        group.push_back(new_node);
      }
    }